

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  AV1_PRIMARY *pAVar4;
  AV1_COMP *cpi;
  uint *puVar5;
  LAYER_CONTEXT *pLVar6;
  undefined1 auVar7 [16];
  _Bool _Var8;
  uint uVar9;
  aom_codec_err_t aVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int64_t iVar17;
  int iVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int iVar23;
  ulong uVar24;
  
  pAVar4 = ctx->ppi;
  cpi = pAVar4->cpi;
  uVar9 = args->gp_offset;
  if ((ulong)uVar9 < 0x29) {
    puVar11 = (undefined8 *)((ulong)uVar9 + (long)args->reg_save_area);
    args->gp_offset = uVar9 + 8;
  }
  else {
    puVar11 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar11 + 1;
  }
  puVar5 = (uint *)*puVar11;
  uVar9 = *puVar5;
  pAVar4->number_spatial_layers = uVar9;
  uVar15 = puVar5[1];
  pAVar4->number_temporal_layers = uVar15;
  (cpi->svc).number_spatial_layers = uVar9;
  (cpi->svc).number_temporal_layers = uVar15;
  uVar19 = (cpi->svc).prev_number_temporal_layers;
  if (((uVar19 != 0) && (uVar3 = (cpi->svc).prev_number_spatial_layers, uVar3 != 0)) &&
     ((uVar15 != uVar19 || (uVar9 != uVar3)))) {
    (pAVar4->seq_params).operating_points_cnt_minus_1 = uVar15 * uVar9 + -1;
    *(byte *)&ctx->next_frame_flags = (byte)ctx->next_frame_flags | 1;
    av1_set_svc_seq_params(pAVar4);
    uVar24._0_4_ = (cpi->svc).spatial_layer_id;
    uVar24._4_4_ = (cpi->svc).temporal_layer_id;
    uVar1 = (cpi->svc).number_spatial_layers;
    uVar2 = (cpi->svc).number_temporal_layers;
    iVar22 = uVar1 + -1;
    iVar23 = uVar2 + -1;
    auVar21._0_8_ =
         CONCAT44(-(uint)((int)uVar24._4_4_ < iVar23),-(uint)((int)(undefined4)uVar24 < iVar22));
    auVar21._8_8_ = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar24 & auVar21._0_8_;
    auVar7._4_4_ = iVar23;
    auVar7._0_4_ = iVar22;
    auVar7._8_4_ = 0xffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar20 = ~auVar21 & auVar7 | auVar20;
    uVar24 = CONCAT44(-(uint)(0 < auVar20._4_4_),-(uint)(0 < auVar20._0_4_)) & auVar20._0_8_;
    (cpi->svc).spatial_layer_id = (int)uVar24;
    (cpi->svc).temporal_layer_id = (int)(uVar24 >> 0x20);
    iVar18 = (cpi->common).temporal_layer_id;
    iVar16 = (cpi->common).spatial_layer_id;
    if (iVar16 < iVar22) {
      iVar22 = iVar16;
    }
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    if (iVar18 < iVar23) {
      iVar23 = iVar18;
    }
    if (iVar23 < 1) {
      iVar23 = 0;
    }
    (cpi->common).spatial_layer_id = iVar22;
    (cpi->common).temporal_layer_id = iVar23;
    uVar15 = pAVar4->number_temporal_layers;
    uVar9 = pAVar4->number_spatial_layers;
  }
  if ((uVar9 < 2) && (uVar15 < 2)) {
    if (pAVar4->seq_params_locked == 0) {
LAB_002b153a:
      aVar10 = update_encoder_cfg(ctx);
      return aVar10;
    }
  }
  else {
    ctx->ppi->use_svc = 1;
    uVar15 = uVar15 * uVar9;
    if (0 < (int)uVar15) {
      uVar24 = 0;
      do {
        if (0x3f < (int)puVar5[uVar24 + 2]) {
          return AOM_CODEC_INVALID_PARAM;
        }
        if ((int)puVar5[uVar24 + 0x22] < 0) {
          return AOM_CODEC_INVALID_PARAM;
        }
        if ((int)puVar5[uVar24 + 2] < (int)puVar5[uVar24 + 0x22]) {
          return AOM_CODEC_INVALID_PARAM;
        }
        uVar24 = uVar24 + 1;
      } while (uVar15 != uVar24);
    }
    _Var8 = av1_alloc_layer_context(cpi,uVar15);
    if (!_Var8) {
      return AOM_CODEC_MEM_ERROR;
    }
    uVar9 = pAVar4->number_spatial_layers;
    if ((ulong)uVar9 == 0) {
      iVar17 = 0;
    }
    else {
      uVar15 = pAVar4->number_temporal_layers;
      iVar18 = 0;
      uVar24 = 0;
      iVar17 = 0;
      do {
        if (uVar15 != 0) {
          pLVar6 = (cpi->svc).layer_context;
          lVar14 = 0;
          do {
            lVar13 = (long)(iVar18 + (int)lVar14);
            pLVar6[lVar13].max_q = puVar5[lVar13 + 2];
            pLVar6[lVar13].min_q = puVar5[lVar13 + 0x22];
            uVar19 = puVar5[uVar24 + 0x42];
            if ((int)uVar19 < 2) {
              uVar19 = 1;
            }
            pLVar6[lVar13].scaling_factor_num = uVar19;
            uVar19 = puVar5[uVar24 + 0x46];
            if ((int)uVar19 < 2) {
              uVar19 = 1;
            }
            pLVar6[lVar13].scaling_factor_den = uVar19;
            iVar16 = puVar5[lVar13 + 0x4a] * 1000;
            if (0x20c49b < (int)puVar5[lVar13 + 0x4a]) {
              iVar16 = 0x7fffffff;
            }
            pLVar6[lVar13].layer_target_bitrate = (long)iVar16;
            pLVar6[lVar13].framerate_factor = puVar5[lVar14 + 0x6a];
            lVar13 = (long)iVar16;
            if ((int)lVar14 - uVar15 != -1) {
              lVar13 = 0;
            }
            iVar17 = iVar17 + lVar13;
            lVar14 = lVar14 + 1;
          } while ((uint)lVar14 != uVar15);
        }
        uVar24 = uVar24 + 1;
        iVar18 = iVar18 + uVar15;
      } while (uVar24 != uVar9);
    }
    iVar18 = pAVar4->seq_params_locked;
    (cpi->oxcf).rc_cfg.target_bandwidth = iVar17;
    (ctx->oxcf).rc_cfg.target_bandwidth = iVar17;
    if (iVar18 == 0) {
      (pAVar4->seq_params).operating_points_cnt_minus_1 =
           uVar9 * pAVar4->number_temporal_layers + -1;
      av1_init_layer_context(cpi);
      goto LAB_002b153a;
    }
    lVar14 = (cpi->oxcf).rc_cfg.target_bandwidth;
    lVar13 = (cpi->oxcf).rc_cfg.optimal_buffer_level_ms;
    lVar12 = (cpi->oxcf).rc_cfg.maximum_buffer_size_ms;
    (pAVar4->p_rc).starting_buffer_level =
         ((cpi->oxcf).rc_cfg.starting_buffer_level_ms * lVar14) / 1000;
    if (lVar13 == 0) {
      lVar13 = lVar14 + 7;
      if (-1 < lVar14) {
        lVar13 = lVar14;
      }
      lVar13 = lVar13 >> 3;
    }
    else {
      lVar13 = (lVar13 * lVar14) / 1000;
    }
    (pAVar4->p_rc).optimal_buffer_level = lVar13;
    if (lVar12 == 0) {
      lVar13 = lVar14 + 7;
      if (-1 < lVar14) {
        lVar13 = lVar14;
      }
      lVar13 = lVar13 >> 3;
    }
    else {
      lVar13 = (lVar12 * lVar14) / 1000;
    }
    (pAVar4->p_rc).maximum_buffer_size = lVar13;
    lVar14 = (pAVar4->p_rc).buffer_level;
    lVar12 = (pAVar4->p_rc).bits_off_target;
    if (lVar13 <= lVar12) {
      lVar12 = lVar13;
    }
    (pAVar4->p_rc).bits_off_target = lVar12;
    if (lVar14 < lVar13) {
      lVar13 = lVar14;
    }
    (pAVar4->p_rc).buffer_level = lVar13;
    av1_update_layer_context_change_config(cpi,iVar17);
    if ((uint)(cpi->svc).number_spatial_layers < (cpi->common).current_frame.frame_number) {
      pAVar4 = cpi->ppi;
      if (pAVar4->use_svc == 0) {
        iVar18 = (cpi->rc).avg_frame_bandwidth;
        iVar16 = (cpi->rc).prev_avg_frame_bandwidth >> 1;
        if (iVar16 < iVar18 / 3 || iVar18 < iVar16) {
          (cpi->rc).rc_1_frame = 0;
          (cpi->rc).rc_2_frame = 0;
          iVar17 = (pAVar4->p_rc).optimal_buffer_level;
          (pAVar4->p_rc).bits_off_target = iVar17;
          (pAVar4->p_rc).buffer_level = iVar17;
        }
      }
      else {
        av1_svc_check_reset_layer_rc_flag(cpi);
      }
    }
  }
  av1_check_fpmt_config(ctx->ppi,&ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  aom_svc_params_t *const params = va_arg(args, aom_svc_params_t *);
  int64_t target_bandwidth = 0;
  ppi->number_spatial_layers = params->number_spatial_layers;
  ppi->number_temporal_layers = params->number_temporal_layers;
  cpi->svc.number_spatial_layers = params->number_spatial_layers;
  cpi->svc.number_temporal_layers = params->number_temporal_layers;
  // Sequence parameters (operating_points_cnt_minus_1, operating_point_idc[])
  // need to be updated if the number of layers have changed.
  // Force a keyframe here and update the two relevant sequence parameters.
  if (cpi->svc.prev_number_temporal_layers &&
      cpi->svc.prev_number_spatial_layers &&
      (cpi->svc.number_temporal_layers !=
           cpi->svc.prev_number_temporal_layers ||
       cpi->svc.number_spatial_layers != cpi->svc.prev_number_spatial_layers)) {
    SequenceHeader *const seq_params = &ppi->seq_params;
    seq_params->operating_points_cnt_minus_1 =
        ppi->number_spatial_layers * ppi->number_temporal_layers - 1;
    ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;
    av1_set_svc_seq_params(ppi);
    // Check for valid values for the spatial/temporal_layer_id here, since
    // there has been a dynamic change in the number_spatial/temporal_layers,
    // and if the ctrl_set_layer_id is not used after this call, the
    // previous (last_encoded) values of spatial/temporal_layer_id will be used,
    // which may be invalid.
    cpi->svc.spatial_layer_id = AOMMAX(
        0,
        AOMMIN(cpi->svc.spatial_layer_id, cpi->svc.number_spatial_layers - 1));
    cpi->svc.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->svc.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
    cpi->common.spatial_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.spatial_layer_id,
                         cpi->svc.number_spatial_layers - 1));
    cpi->common.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
  }

  if (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1) {
    unsigned int sl, tl;
    ctx->ppi->use_svc = 1;
    const int num_layers =
        ppi->number_spatial_layers * ppi->number_temporal_layers;
    for (int layer = 0; layer < num_layers; ++layer) {
      if (params->max_quantizers[layer] > 63 ||
          params->min_quantizers[layer] < 0 ||
          params->min_quantizers[layer] > params->max_quantizers[layer]) {
        return AOM_CODEC_INVALID_PARAM;
      }
    }
    if (!av1_alloc_layer_context(cpi, num_layers)) return AOM_CODEC_MEM_ERROR;

    for (sl = 0; sl < ppi->number_spatial_layers; ++sl) {
      for (tl = 0; tl < ppi->number_temporal_layers; ++tl) {
        const int layer = LAYER_IDS_TO_IDX(sl, tl, ppi->number_temporal_layers);
        LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
        lc->max_q = params->max_quantizers[layer];
        lc->min_q = params->min_quantizers[layer];
        lc->scaling_factor_num = AOMMAX(1, params->scaling_factor_num[sl]);
        lc->scaling_factor_den = AOMMAX(1, params->scaling_factor_den[sl]);
        const int layer_target_bitrate = params->layer_target_bitrate[layer];
        if (layer_target_bitrate > INT_MAX / 1000) {
          lc->layer_target_bitrate = INT_MAX;
        } else {
          lc->layer_target_bitrate = 1000 * layer_target_bitrate;
        }
        lc->framerate_factor = params->framerate_factor[tl];
        if (tl == ppi->number_temporal_layers - 1)
          target_bandwidth += lc->layer_target_bitrate;
      }
    }

    if (ppi->seq_params_locked) {
      AV1EncoderConfig *const oxcf = &cpi->oxcf;
      // Keep ctx->oxcf in sync in case further codec controls are made prior
      // to encoding.
      ctx->oxcf.rc_cfg.target_bandwidth = oxcf->rc_cfg.target_bandwidth =
          target_bandwidth;
      set_primary_rc_buffer_sizes(oxcf, ppi);
      av1_update_layer_context_change_config(cpi, target_bandwidth);
      check_reset_rc_flag(cpi);
    } else {
      // Note av1_init_layer_context() relies on cpi->oxcf. The order of that
      // call and the ones in the other half of this block (which
      // update_encoder_cfg() transitively makes) is important. So we keep
      // ctx->oxcf and cpi->oxcf in sync here as update_encoder_cfg() will
      // overwrite cpi->oxcf with ctx->oxcf.
      ctx->oxcf.rc_cfg.target_bandwidth = cpi->oxcf.rc_cfg.target_bandwidth =
          target_bandwidth;
      SequenceHeader *const seq_params = &ppi->seq_params;
      seq_params->operating_points_cnt_minus_1 =
          ppi->number_spatial_layers * ppi->number_temporal_layers - 1;

      av1_init_layer_context(cpi);
      // update_encoder_cfg() is somewhat costly and this control may be called
      // multiple times, so update_encoder_cfg() is only called to ensure frame
      // and superblock sizes are updated before they're fixed by the first
      // encode call.
      return update_encoder_cfg(ctx);
    }
  } else if (!ppi->seq_params_locked) {
    // Ensure frame and superblock sizes are updated.
    return update_encoder_cfg(ctx);
  }
  av1_check_fpmt_config(ctx->ppi, &ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}